

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboMultisampleTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::FboMultisampleTests::init(FboMultisampleTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  TestContext *testCtx;
  Context *pCVar2;
  undefined8 in_RAX;
  TestNode *node;
  undefined8 extraout_RAX;
  BasicFboMultisampleCase *pBVar3;
  char *pcVar4;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  long lVar5;
  int samples;
  long local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  lVar5 = 0;
  while (lVar5 != 3) {
    samples = init::sampleCounts[lVar5];
    node = (TestNode *)operator_new(0x70);
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    de::toString<int>(&local_50,&samples);
    std::operator+(&local_70,&local_50,"_samples");
    local_78 = lVar5;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,testCtx,local_70._M_dataplus._M_p,"");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    tcu::TestNode::addChild((TestNode *)this,node);
    in_RAX = extraout_RAX;
    for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 4) {
      pBVar3 = (BasicFboMultisampleCase *)operator_new(0xa0);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      dVar1 = *(deUint32 *)((long)init::colorFormats + lVar5);
      pcVar4 = FboTestUtil::getFormatName(dVar1);
      local_70._M_dataplus._M_p = (char *)0x8300000077;
      BasicFboMultisampleCase::BasicFboMultisampleCase
                (pBVar3,pCVar2,pcVar4,"",dVar1,0,(IVec2 *)&local_70,samples);
      tcu::TestNode::addChild(node,(TestNode *)pBVar3);
      in_RAX = extraout_RAX_00;
    }
    for (lVar5 = 0; lVar5 != 0x18; lVar5 = lVar5 + 4) {
      pBVar3 = (BasicFboMultisampleCase *)operator_new(0xa0);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      dVar1 = *(deUint32 *)((long)init::depthStencilFormats + lVar5);
      pcVar4 = FboTestUtil::getFormatName(dVar1);
      local_70._M_dataplus._M_p = (char *)0x8300000077;
      BasicFboMultisampleCase::BasicFboMultisampleCase
                (pBVar3,pCVar2,pcVar4,"",0x8058,dVar1,(IVec2 *)&local_70,samples);
      tcu::TestNode::addChild(node,(TestNode *)pBVar3);
      in_RAX = extraout_RAX_01;
    }
    lVar5 = local_78 + 1;
  }
  return (int)in_RAX;
}

Assistant:

void FboMultisampleTests::init (void)
{
	static const deUint32 colorFormats[] =
	{
		// RGBA formats
		GL_RGBA8,
		GL_SRGB8_ALPHA8,
		GL_RGB10_A2,
		GL_RGBA4,
		GL_RGB5_A1,

		// RGB formats
		GL_RGB8,
		GL_RGB565,

		// RG formats
		GL_RG8,

		// R formats
		GL_R8,

		// GL_EXT_color_buffer_float
		GL_RGBA32F,
		GL_RGBA16F,
		GL_R11F_G11F_B10F,
		GL_RG32F,
		GL_RG16F,
		GL_R32F,
		GL_R16F
	};

	static const deUint32 depthStencilFormats[] =
	{
		GL_DEPTH_COMPONENT32F,
		GL_DEPTH_COMPONENT24,
		GL_DEPTH_COMPONENT16,
		GL_DEPTH32F_STENCIL8,
		GL_DEPTH24_STENCIL8,
		GL_STENCIL_INDEX8
	};

	static const int sampleCounts[] = { 2, 4, 8 };

	for (int sampleCntNdx = 0; sampleCntNdx < DE_LENGTH_OF_ARRAY(sampleCounts); sampleCntNdx++)
	{
		int					samples				= sampleCounts[sampleCntNdx];
		tcu::TestCaseGroup*	sampleCountGroup	= new tcu::TestCaseGroup(m_testCtx, (de::toString(samples) + "_samples").c_str(), "");
		addChild(sampleCountGroup);

		// Color formats.
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
			sampleCountGroup->addChild(new BasicFboMultisampleCase(m_context, getFormatName(colorFormats[fmtNdx]), "", colorFormats[fmtNdx], GL_NONE, IVec2(119, 131), samples));

		// Depth/stencil formats.
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); fmtNdx++)
			sampleCountGroup->addChild(new BasicFboMultisampleCase(m_context, getFormatName(depthStencilFormats[fmtNdx]), "", GL_RGBA8, depthStencilFormats[fmtNdx], IVec2(119, 131), samples));
	}
}